

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
__thiscall Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RationalConstantType>>(PolyNf *this)

{
  byte bVar1;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *extraout_RDX;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RSI;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  PVar2;
  anon_class_16_2_f84bbffd f;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> SStack_58;
  ulong local_38 [4];
  
  bVar1 = (byte)(in_RSI->_summands)._capacity;
  if ((bVar1 & 3) == 2) {
    *(undefined4 *)
     &(this->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
         = *(undefined4 *)((long)&(in_RSI->_summands)._capacity + 2);
    *(undefined8 *)
     ((this->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content + 7) = *(undefined8 *)((long)&(in_RSI->_summands)._stack + 2);
  }
  else {
    local_38[1] = 0;
    local_38[2] = 0;
    local_38[0] = (ulong)bVar1 & 0xffffffffffffff03;
    f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
               *)in_RSI;
    f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
              *)local_38;
    ::Lib::CoproductImpl::
    RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                *)local_38,f);
    Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&SStack_58,
               (PolyNf *)local_38);
    ::Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)this,(Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&SStack_58);
    ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
              (&SStack_58);
    in_RSI = extraout_RDX;
  }
  PVar2._ptr = in_RSI;
  PVar2._0_8_ = this;
  return PVar2;
}

Assistant:

Perfect<Polynom<Number>> PolyNf::wrapPoly() const
{
  if (this->is<AnyPoly>()) {
    return this->unwrap<AnyPoly>()
            .unwrap<Perfect<Polynom<Number>>>();
  } else {
    return perfect(Polynom<Number>(*this));
  }
}